

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

void Curl_conncache_remove_conn(Curl_easy *data,connectdata *conn,_Bool lock)

{
  connectbundle *bundle_00;
  conncache *connc_00;
  conncache *connc;
  connectbundle *bundle;
  _Bool lock_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  bundle_00 = conn->bundle;
  connc_00 = (data->state).conn_cache;
  if (bundle_00 != (connectbundle *)0x0) {
    if ((lock) && (data->share != (Curl_share *)0x0)) {
      Curl_share_lock(data,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
    }
    bundle_remove_conn(bundle_00,conn);
    if (bundle_00->num_connections == 0) {
      conncache_remove_bundle(connc_00,bundle_00);
    }
    conn->bundle = (connectbundle *)0x0;
    if (connc_00 != (conncache *)0x0) {
      connc_00->num_conn = connc_00->num_conn - 1;
    }
    if ((lock) && (data->share != (Curl_share *)0x0)) {
      Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
    }
  }
  return;
}

Assistant:

void Curl_conncache_remove_conn(struct Curl_easy *data,
                                struct connectdata *conn, bool lock)
{
  struct connectbundle *bundle = conn->bundle;
  struct conncache *connc = data->state.conn_cache;

  /* The bundle pointer can be NULL, since this function can be called
     due to a failed connection attempt, before being added to a bundle */
  if(bundle) {
    if(lock) {
      CONNCACHE_LOCK(data);
    }
    bundle_remove_conn(bundle, conn);
    if(bundle->num_connections == 0)
      conncache_remove_bundle(connc, bundle);
    conn->bundle = NULL; /* removed from it */
    if(connc) {
      connc->num_conn--;
      DEBUGF(infof(data, "The cache now contains %zu members",
                   connc->num_conn));
    }
    if(lock) {
      CONNCACHE_UNLOCK(data);
    }
  }
}